

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SockAddr.cpp
# Opt level: O0

char * AGSSock::SockAddr_get_IP(SockAddr *sa)

{
  sockaddr_in6 *addr_1;
  char buffer_1 [46];
  sockaddr_in *addr;
  char buffer [16];
  SockAddr *sa_local;
  
  buffer._8_8_ = sa;
  if ((sa->super_sockaddr_storage).ss_family == 2) {
    memset(&addr,0,0x10);
    inet_ntop((uint)*(ushort *)buffer._8_8_,(void *)(buffer._8_8_ + 4),(char *)&addr,0x10);
    sa_local = (SockAddr *)(**(code **)(*AGSSockAPI::engine + 0x248))(AGSSockAPI::engine,&addr);
  }
  else if ((sa->super_sockaddr_storage).ss_family == 10) {
    memset(&addr_1,0,0x2e);
    inet_ntop((uint)*(ushort *)buffer._8_8_,(void *)(buffer._8_8_ + 8),(char *)&addr_1,0x2e);
    sa_local = (SockAddr *)(**(code **)(*AGSSockAPI::engine + 0x248))(AGSSockAPI::engine,&addr_1);
  }
  else {
    sa_local = (SockAddr *)0x0;
  }
  return (char *)sa_local;
}

Assistant:

const char *SockAddr_get_IP(SockAddr *sa)
{
	if (sa->ss_family == AF_INET)
	{
		char buffer[INET_ADDRSTRLEN] = "";
		sockaddr_in *addr = reinterpret_cast<sockaddr_in *> (sa);
		inet_ntop(sa->ss_family, &addr->sin_addr, buffer, sizeof (buffer));
		return AGS_STRING(buffer);
	}
	else if (sa->ss_family == AF_INET6)
	{
		char buffer[INET6_ADDRSTRLEN] = "";
		sockaddr_in6 *addr = reinterpret_cast<sockaddr_in6 *> (sa);
		inet_ntop(sa->ss_family, &addr->sin6_addr, buffer, sizeof (buffer));
		return AGS_STRING(buffer);
	}
	return nullptr;
}